

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjExporter::AddNode(ObjExporter *this,aiNode *nd,aiMatrix4x4 *mParent)

{
  aiMesh *paVar1;
  float local_78;
  float local_74;
  uint i_1;
  uint i;
  aiMesh *cm;
  aiMatrix4x4 *local_28;
  aiMatrix4x4 *mAbs;
  aiMatrix4x4 *mParent_local;
  aiNode *nd_local;
  ObjExporter *this_local;
  
  mAbs = mParent;
  mParent_local = (aiMatrix4x4 *)nd;
  nd_local = (aiNode *)this;
  aiMatrix4x4t<float>::operator*((aiMatrix4x4t<float> *)&cm,mParent,&nd->mTransformation);
  local_28 = (aiMatrix4x4 *)&cm;
  for (local_74 = 0.0; (uint)local_74 < (uint)mParent_local[0x11].c1;
      local_74 = (float)((int)local_74 + 1)) {
    paVar1 = this->pScene->mMeshes
             [*(uint *)(*(long *)&mParent_local[0x11].c3 + (ulong)(uint)local_74 * 4)];
    if (paVar1 == (aiMesh *)0x0) {
      AddMesh(this,(aiString *)mParent_local,
              this->pScene->mMeshes
              [*(uint *)(*(long *)&mParent_local[0x11].c3 + (ulong)(uint)local_74 * 4)],local_28);
    }
    else {
      AddMesh(this,&paVar1->mName,
              this->pScene->mMeshes
              [*(uint *)(*(long *)&mParent_local[0x11].c3 + (ulong)(uint)local_74 * 4)],local_28);
    }
  }
  for (local_78 = 0.0; (uint)local_78 < (uint)mParent_local[0x11].b1;
      local_78 = (float)((int)local_78 + 1)) {
    AddNode(this,*(aiNode **)(*(long *)&mParent_local[0x11].b3 + (ulong)(uint)local_78 * 8),local_28
           );
  }
  return;
}

Assistant:

void ObjExporter::AddNode(const aiNode* nd, const aiMatrix4x4& mParent) {
    const aiMatrix4x4& mAbs = mParent * nd->mTransformation;

    aiMesh *cm( nullptr );
    for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
        cm = pScene->mMeshes[nd->mMeshes[i]];
        if (nullptr != cm) {
            AddMesh(cm->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        } else {
            AddMesh(nd->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        }
    }

    for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
        AddNode(nd->mChildren[i], mAbs);
    }
}